

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,3>,tcu::Vector<float,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_2>_> *pVVar5;
  pointer pcVar6;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar7;
  Variable<tcu::Vector<float,_3>_> *pVVar8;
  undefined8 uVar9;
  undefined7 uVar10;
  PrecisionCase *pPVar11;
  undefined8 uVar12;
  FloatFormat *fmt;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ContextType type;
  int iVar16;
  uint uVar17;
  _Rb_tree_node_base *p_Var18;
  char *__s;
  size_t sVar19;
  long *plVar20;
  ShaderExecutor *pSVar21;
  long lVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  IVal *pIVar25;
  TestError *this_00;
  TestLog *pTVar26;
  Vector<float,_2> *val;
  undefined8 *puVar27;
  IVal *pIVar28;
  string *psVar29;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  *pVVar30;
  byte bVar31;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  outputs;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_538;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  *local_530;
  undefined1 local_528 [8];
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  undefined1 local_508 [16];
  undefined1 local_4f8 [56];
  string local_4c0;
  double local_4a0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_498;
  ResultCollector *local_490;
  undefined1 local_488 [8];
  pointer pVStack_480;
  undefined1 local_478 [16];
  double local_468;
  Data DStack_460;
  undefined4 local_450;
  ios_base local_418 [8];
  ios_base local_410 [264];
  FloatFormat local_308;
  double local_2e0;
  FloatFormat *local_2d8;
  long local_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2c8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  local_298;
  undefined1 local_268 [12];
  YesNoMaybe YStack_25c;
  _Base_ptr p_Stack_258;
  _Rb_tree_node_base *local_250;
  _Base_ptr local_248;
  double dStack_240;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [24];
  undefined8 local_190 [11];
  ios_base local_138 [264];
  
  bVar31 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4f8._40_8_ = (long)pVVar4 - (long)pVVar3 >> 3;
  local_530 = variables;
  local_4f8._48_8_ = stmt;
  local_498 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  ::Outputs(&local_298,local_4f8._40_8_);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_308.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_308.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_308.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_308.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_308.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_308.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_308.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_308.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_308._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c8._M_impl.super__Rb_tree_header._M_header;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_488 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"Statement: ",0xb);
  (*(*(_func_int ***)local_4f8._48_8_)[2])(local_4f8._48_8_,(ostringstream *)&pVStack_480);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_538 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
  std::ios_base::~ios_base(local_410);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_268 + 8);
  stack0xfffffffffffffda0 = (double)((ulong)YStack_25c << 0x20);
  p_Stack_258 = (_Base_ptr)0x0;
  dStack_240 = 0.0;
  local_250 = p_Var2;
  local_248 = p_Var2;
  (*(*(_func_int ***)local_4f8._48_8_)[4])(local_4f8._48_8_,local_268);
  if (local_250 != p_Var2) {
    p_Var18 = local_250;
    do {
      (**(code **)(**(long **)(p_Var18 + 1) + 0x30))(*(long **)(p_Var18 + 1),local_1a8);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != p_Var2);
  }
  pPVar11 = local_538;
  if (dStack_240 != 0.0) {
    local_488 = (undefined1  [8])((local_538->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480,(char *)local_508._0_8_,local_508._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_508._0_8_ != (IVal *)local_4f8) {
      operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
    std::ios_base::~ios_base(local_410);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"precision ",10);
  __s = glu::getPrecisionName((pPVar11->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_538 + (long)((TestLog *)((long)local_488 + -0x18))->m_log) +
                    0xb0);
  }
  else {
    sVar19 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,__s,sVar19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_538->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar30 = local_530;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_538->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_538->m_extension);
    plVar20 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar26 = (TestLog *)(plVar20 + 2);
    if ((TestLog *)*plVar20 == pTVar26) {
      local_478._0_8_ = pTVar26->m_log;
      local_478._8_8_ = plVar20[3];
      local_488 = (undefined1  [8])local_478;
    }
    else {
      local_478._0_8_ = pTVar26->m_log;
      local_488 = (undefined1  [8])*plVar20;
    }
    pVStack_480 = (pointer)plVar20[1];
    *plVar20 = (long)pTVar26;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_488);
    if (local_488 != (undefined1  [8])local_478) {
      operator_delete((void *)local_488,(ulong)(local_478._0_8_ + 1));
    }
    pVVar30 = local_530;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_488,local_538,
             (pVVar30->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if (local_488 != (undefined1  [8])local_478) {
    operator_delete((void *)local_488,(ulong)(local_478._0_8_ + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,local_538,
             (local_530->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_488);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  pVVar30 = local_530;
  if (local_488 != (undefined1  [8])local_478) {
    operator_delete((void *)local_488,(ulong)(local_478._0_8_ + 1));
  }
  makeSymbol<tcu::Matrix<float,2,3>>
            ((Symbol *)local_488,local_538,
             (pVVar30->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr);
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if (local_488 != (undefined1  [8])local_478) {
    operator_delete((void *)local_488,(ulong)(local_478._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  (*(*(_func_int ***)local_4f8._48_8_)[2])(local_4f8._48_8_,local_488);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar11 = local_538;
  pSVar21 = ShaderExecUtil::createExecutor
                      ((local_538->m_ctx).renderContext,(local_538->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_488 = (undefined1  [8])
              (local_498->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_480 = (local_498->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_478._0_8_ =
       (local_498->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478._8_8_ =
       (local_498->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_298.out0.
       super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_298.out1.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar21->_vptr_ShaderExecutor[3])
            (pSVar21,((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar16 = (*pSVar21->_vptr_ShaderExecutor[2])(pSVar21);
  if ((char)iVar16 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar21->_vptr_ShaderExecutor[5])(pSVar21);
  (*pSVar21->_vptr_ShaderExecutor[6])(pSVar21,local_4f8._40_8_,local_488,local_1a8);
  (*pSVar21->_vptr_ShaderExecutor[1])(pSVar21);
  local_268[0] = false;
  stack0xfffffffffffffda0 = INFINITY;
  p_Stack_258 = (_Base_ptr)0xfff0000000000000;
  local_250 = (_Rb_tree_node_base *)((ulong)local_250 & 0xffffffffffffff00);
  local_248 = (_Base_ptr)0x7ff0000000000000;
  dStack_240 = -INFINITY;
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_488);
  pVVar30 = local_530;
  local_2d8 = &(pPVar11->m_ctx).floatFormat;
  lVar22 = 8;
  do {
    local_1a8[lVar22 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x50);
  lVar22 = 8;
  do {
    local_1a8[lVar22 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x50);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2c8,
             (local_530->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_268);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar30->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_508);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar30->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_528);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar30->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_2c8,
             (pVVar30->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr,(IVal *)local_488);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2c8,
             (pVVar30->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  if (pVVar4 == pVVar3) {
LAB_01788e79:
    local_488 = (undefined1  [8])((local_538->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_490 = &local_538->m_status;
    local_2e0 = (double)(local_4f8._40_8_ + (ulong)((double)local_4f8._40_8_ == 0.0));
    local_4f8._32_8_ = 0.0;
    local_4a0 = 0.0;
    do {
      tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
      lVar22 = 8;
      do {
        local_268[lVar22 + -8] = 0;
        *(undefined8 *)(local_268 + lVar22) = 0x7ff0000000000000;
        *(undefined8 *)(local_268 + lVar22 + 8) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x50);
      lVar22 = 8;
      do {
        local_268[lVar22 + -8] = 0;
        *(undefined8 *)(local_268 + lVar22) = 0x7ff0000000000000;
        *(undefined8 *)(local_268 + lVar22 + 8) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x50);
      if ((local_4f8._32_8_ & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_538->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_2d8;
      pVVar3 = (local_498->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_528._0_4_ = pVVar3[local_4f8._32_8_].m_data[0];
      local_528._4_4_ = pVVar3[local_4f8._32_8_].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_508,local_2d8,(Vector<float,_2> *)local_528);
      pVVar30 = local_530;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_488,fmt,(IVal *)local_508);
      pIVar23 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2c8,
                           (pVVar30->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar23->m_data[1].m_lo = local_468;
      pIVar23->m_data[1].m_hi = (double)CONCAT44(DStack_460.basic.precision,DStack_460.basic.type);
      pIVar23->m_data[0].m_hi = (double)local_478._0_8_;
      *(undefined8 *)(pIVar23->m_data + 1) = local_478._8_8_;
      pIVar23->m_data[0].m_hasNaN = local_488;
      pIVar23->m_data[0].m_lo = (double)pVStack_480;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (pVVar30->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (pVVar30->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (pVVar30->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_460.basic.type = (local_538->m_ctx).precision;
      local_468 = fmt->m_maxValue;
      local_488 = *(undefined1 (*) [8])fmt;
      pVStack_480 = *(pointer *)&fmt->m_fractionBits;
      local_478._0_8_ = *(undefined8 *)&fmt->m_hasInf;
      local_478._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_450 = 0;
      DStack_460._8_8_ = &local_2c8;
      (*(*(_func_int ***)local_4f8._48_8_)[3])(local_4f8._48_8_,(IVal *)local_488);
      pIVar24 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2c8,
                           (pVVar30->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,&local_308,pIVar24);
      uVar12 = local_4f8._32_8_;
      pIVar24 = (IVal *)local_488;
      pIVar28 = (IVal *)local_268;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        uVar10 = *(undefined7 *)&pIVar24->m_data[0].field_0x1;
        pIVar28->m_data[0].m_hasNaN = pIVar24->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar28->m_data[0].field_0x1 = uVar10;
        pIVar24 = (IVal *)((long)pIVar24 + ((ulong)bVar31 * -2 + 1) * 8);
        pIVar28 = (IVal *)((long)pIVar28 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      local_2d0 = local_4f8._32_8_ * 0xc;
      bVar13 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_268,
                          local_298.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_4f8._32_8_);
      local_488 = (undefined1  [8])local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 1 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_490,bVar13,(string *)local_488);
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,(ulong)(local_478._0_8_ + 1));
      }
      pIVar25 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_2c8,
                           (local_530->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_488,&local_308,pIVar25);
      puVar27 = (undefined8 *)local_1a8;
      psVar29 = (string *)local_488;
      bVar15 = true;
      do {
        bVar14 = bVar15;
        lVar22 = 0;
        do {
          *(undefined8 *)((long)puVar27 + lVar22 + 0x10) =
               *(undefined8 *)((long)&psVar29->field_2 + lVar22);
          puVar1 = (undefined8 *)((long)&(psVar29->_M_dataplus)._M_p + lVar22);
          uVar9 = puVar1[1];
          *(undefined8 *)((long)puVar27 + lVar22) = *puVar1;
          ((undefined8 *)((long)puVar27 + lVar22))[1] = uVar9;
          lVar22 = lVar22 + 0x30;
        } while (lVar22 != 0x90);
        puVar27 = local_190;
        psVar29 = (string *)(local_478 + 8);
        bVar15 = false;
      } while (bVar14);
      bVar15 = contains<tcu::Matrix<float,2,3>>
                         ((IVal *)local_1a8,
                          local_298.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar12);
      local_488 = (undefined1  [8])local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(local_490,bVar15,(string *)local_488);
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,(ulong)(local_478._0_8_ + 1));
      }
      pVVar30 = local_530;
      if (!bVar13 || !bVar15) {
        uVar17 = SUB84(local_4a0,0) + 1;
        local_4a0 = (double)(ulong)uVar17;
        if ((int)uVar17 < 0x65) {
          local_488 = (undefined1  [8])((local_538->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\t",1);
          pVVar5 = (pVVar30->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          val = (Vector<float,_2> *)local_4f8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_508._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,(char *)local_508._0_8_,local_508._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_528,(BuiltinPrecisionTests *)&local_308,
                     (FloatFormat *)
                     ((local_498->in0).
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_4f8._32_8_),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,(char *)CONCAT44(local_528._4_4_,local_528._0_4_),
                     local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_528._4_4_,local_528._0_4_) != &local_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_528._4_4_,local_528._0_4_),
                            local_518._M_allocated_capacity + 1);
          }
          if ((Vector<float,_2> *)local_508._0_8_ != (Vector<float,_2> *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\t",1);
          pVVar7 = (pVVar30->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                   .m_ptr;
          pIVar25 = (IVal *)local_4f8;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          local_508._0_8_ = pIVar25;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,(char *)local_508._0_8_,local_508._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," = ",3);
          valueToString<tcu::Matrix<float,2,3>>
                    ((string *)local_528,(BuiltinPrecisionTests *)&local_308,
                     (FloatFormat *)
                     (local_298.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar12),
                     (Matrix<float,_2,_3> *)pIVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,(char *)CONCAT44(local_528._4_4_,local_528._0_4_),
                     local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,3>>
                    (&local_4c0,(BuiltinPrecisionTests *)&local_308,(FloatFormat *)local_1a8,pIVar25
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_528._4_4_,local_528._0_4_) != &local_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_528._4_4_,local_528._0_4_),
                            local_518._M_allocated_capacity + 1);
          }
          if ((IVal *)local_508._0_8_ != (IVal *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\t",1);
          pVVar8 = (pVVar30->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pIVar24 = (IVal *)local_4f8;
          pcVar6 = (pVVar8->m_name)._M_dataplus._M_p;
          local_508._0_8_ = pIVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,pcVar6,pcVar6 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,(char *)local_508._0_8_,local_508._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_528,(BuiltinPrecisionTests *)&local_308,
                     (FloatFormat *)
                     ((long)(local_298.out1.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + local_2d0),
                     (Vector<float,_3> *)pIVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,(char *)CONCAT44(local_528._4_4_,local_528._0_4_),
                     local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    (&local_4c0,(BuiltinPrecisionTests *)&local_308,(FloatFormat *)local_268,pIVar24
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_528._4_4_,local_528._0_4_) != &local_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_528._4_4_,local_528._0_4_),
                            local_518._M_allocated_capacity + 1);
          }
          if ((IVal *)local_508._0_8_ != (IVal *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
          std::ios_base::~ios_base(local_410);
        }
      }
      local_4f8._32_8_ = local_4f8._32_8_ + 1;
    } while ((double)local_4f8._32_8_ != local_2e0);
    iVar16 = SUB84(local_4a0,0);
    if (iVar16 < 0x65) {
      if (iVar16 == 0) goto LAB_01788e79;
    }
    else {
      local_488 = (undefined1  [8])((local_538->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_480,iVar16 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
      std::ios_base::~ios_base(local_410);
    }
    local_488 = (undefined1  [8])((local_538->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::ostream::operator<<((ostringstream *)&pVStack_480,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
  std::ios_base::~ios_base(local_410);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_298.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.out0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}